

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webectl.cpp
# Opt level: O0

void send_to_pid(int pid,string *msg)

{
  undefined4 __fd;
  char *__src;
  void *__buf;
  size_t __n;
  ssize_t sVar1;
  __cxx11 local_f0 [32];
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [38];
  undefined1 local_8a [8];
  sockaddr_un name;
  int sock;
  string *msg_local;
  int pid_local;
  
  unique0x1000024f = msg;
  name.sun_path._100_4_ = socket(1,2,0);
  if ((int)name.sun_path._100_4_ < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/webectl.cpp",
            0x33);
    fprintf(_stderr,"--> %s\n","sock");
    perror("info");
    exit(1);
  }
  local_8a._0_2_ = 1;
  std::__cxx11::to_string(local_f0,pid);
  std::operator+((char *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/tmp/webed_")
  ;
  std::operator+(local_b0,(char *)local_d0);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(local_8a + 2,__src);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  __fd = name.sun_path._100_4_;
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  sVar1 = sendto(__fd,__buf,__n,0,(sockaddr *)local_8a,0x6e);
  if (sVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/webectl.cpp",
            0x36);
    fprintf(_stderr,"--> %s\n",
            "sendto(sock, msg.c_str(), msg.size(), 0, (struct sockaddr *)&name, sizeof(struct sockaddr_un))"
           );
    perror("info");
    exit(1);
  }
  close(name.sun_path._100_4_);
  return;
}

Assistant:

void send_to_pid(int pid, std::string msg) {
    int sock;
    struct sockaddr_un name;
    sock = socket(AF_UNIX, SOCK_DGRAM, 0);
    IF_NEGATIVE_EXIT(sock);
    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(pid) + ".sock").c_str());
    IF_NEGATIVE_EXIT(sendto(sock, msg.c_str(), msg.size(), 0, (struct sockaddr *)&name, sizeof(struct sockaddr_un)))
    close(sock);
}